

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O0

span<const_long,_18446744073709551615UL> __thiscall
lf::assemble::DynamicFEDofHandler::GlobalDofIndices(DynamicFEDofHandler *this,Entity *entity)

{
  uint uVar1;
  value_type vVar2;
  int iVar3;
  dim_t dVar4;
  uint uVar5;
  uint uVar6;
  element_type *peVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  const_reference this_00;
  long *plVar10;
  gdof_idx_t *end;
  gdof_idx_t *begin;
  size_type no_covered_dofs;
  size_type idx_offset;
  glb_idx_t entity_index;
  dim_t codim;
  RefEl ref_el_type;
  Entity *entity_local;
  DynamicFEDofHandler *this_local;
  
  _codim = entity;
  iVar3 = (*entity->_vptr_Entity[4])();
  entity_index._3_1_ = (undefined1)iVar3;
  dVar4 = lf::base::RefEl::Dimension((RefEl *)((long)&entity_index + 3));
  uVar5 = 2 - dVar4;
  peVar7 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  uVar6 = (*peVar7->_vptr_Mesh[5])(peVar7,_codim);
  pvVar8 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                     (&this->offsets_,(ulong)uVar5);
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar8,(ulong)uVar6)
  ;
  uVar1 = *pvVar9;
  pvVar8 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                     (&this->offsets_,(ulong)uVar5);
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (pvVar8,(ulong)(uVar6 + 1));
  vVar2 = *pvVar9;
  this_00 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                      (&this->dofs_,(ulong)uVar5);
  plVar10 = std::vector<long,_std::allocator<long>_>::data(this_00);
  std::span<const_long,_18446744073709551615UL>::span<const_long_*,_const_long_*>
            ((span<const_long,_18446744073709551615UL> *)&this_local,plVar10 + uVar1,
             plVar10 + uVar1 + (vVar2 - uVar1));
  return _this_local;
}

Assistant:

std::span<const gdof_idx_t> DynamicFEDofHandler::GlobalDofIndices(
    const lf::mesh::Entity &entity) const {
  // Topological type
  const lf::base::RefEl ref_el_type = entity.RefEl();
  // Co-dimension of entity in a 2D mesh
  const dim_t codim = 2 - ref_el_type.Dimension();
  // Index of current mesh entity
  const glb_idx_t entity_index = mesh_p_->Index(entity);
  // Offset of dof indices for current entity
  const size_type idx_offset = offsets_[codim][entity_index];
  // Number of shape functions covering current entity
  const size_type no_covered_dofs =
      offsets_[codim][entity_index + 1] - idx_offset;
  // Pointers to range of dof indices
  const gdof_idx_t *begin = dofs_[codim].data() + idx_offset;
  const gdof_idx_t *end = begin + no_covered_dofs;
  return {begin, end};
}